

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncSocket.h
# Opt level: O0

pair<char_*,_bool> __thiscall
uWS::AsyncSocket<false>::getSendBuffer(AsyncSocket<false> *this,size_t size)

{
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  size_t in_RSI;
  void *in_RDI;
  pair<char_*,_bool> pVar2;
  char *sendBuffer;
  LoopData *loopData;
  bool local_41;
  char *local_40;
  bool local_31;
  char *local_30;
  LoopData *local_28;
  size_t local_20;
  pair<char_*,_bool> local_10;
  
  local_20 = in_RSI;
  local_28 = getLoopData((AsyncSocket<false> *)0x25ee6d);
  if ((local_28->corkedSocket == in_RDI) && ((long)local_28->corkOffset + local_20 < 0x4000)) {
    local_30 = local_28->corkBuffer + local_28->corkOffset;
    local_28->corkOffset = (int)local_20 + local_28->corkOffset;
    local_31 = false;
    std::pair<char_*,_bool>::pair<char_*&,_bool,_true>(&local_10,&local_30,&local_31);
    uVar1 = extraout_RDX;
  }
  else {
    local_40 = (char *)malloc(local_20);
    local_41 = true;
    std::pair<char_*,_bool>::pair<char_*,_bool,_true>(&local_10,&local_40,&local_41);
    uVar1 = extraout_RDX_00;
  }
  pVar2._9_7_ = (undefined7)((ulong)uVar1 >> 8);
  pVar2.second = local_10.second;
  pVar2.first = local_10.first;
  return pVar2;
}

Assistant:

std::pair<char *, bool> getSendBuffer(size_t size) {
        /* If we are corked and we have room, return the cork buffer itself */
        LoopData *loopData = getLoopData();
        if (loopData->corkedSocket == this && loopData->corkOffset + size < LoopData::CORK_BUFFER_SIZE) {
            char *sendBuffer = loopData->corkBuffer + loopData->corkOffset;
            loopData->corkOffset += (int) size;
            return {sendBuffer, false};
        } else {
            /* Slow path for now, we want to always be corked if possible */
            return {(char *) malloc(size), true};
        }
    }